

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_inverted_11(void)

{
  run("dotted names should be valid for inverted section tags",
      "\"{{^a.b.c}}Not Here{{/a.b.c}}\" == \"\"","{\"a\": {\"b\": {\"c\": true}}}",(char *)0x0,
      "\"\" == \"\"");
  return;
}

Assistant:

static void
test_inverted_11(void)
{
    run(
        "dotted names should be valid for inverted section tags",
        "\"{{^a.b.c}}Not Here{{/a.b.c}}\" == \"\"",
        "{\"a\": {\"b\": {\"c\": true}}}",
        NULL,
        "\"\" == \"\""
    );
}